

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeMinimumRequired.cxx
# Opt level: O0

bool __thiscall
cmCMakeMinimumRequired::InitialPass
          (cmCMakeMinimumRequired *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uVar8;
  ostream *poVar9;
  allocator local_449;
  string local_448;
  string local_428;
  undefined1 local_408 [8];
  ostringstream e_1;
  string local_290;
  undefined1 local_270 [8];
  ostringstream e;
  uint local_f4;
  uint local_f0;
  uint required_tweak;
  uint required_patch;
  uint required_minor;
  uint required_major;
  uint current_tweak;
  uint current_patch;
  uint current_minor;
  uint current_major;
  allocator local_a9;
  string local_a8;
  undefined4 local_88;
  allocator local_81;
  string local_80;
  uint local_50;
  byte local_49;
  uint i;
  bool doing_version;
  string version_string;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakeMinimumRequired *this_local;
  
  version_string.field_2._8_8_ = param_2;
  std::__cxx11::string::string((string *)&i);
  local_49 = 0;
  local_50 = 0;
  do {
    uVar6 = (ulong)local_50;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar4 <= uVar6) {
      if ((local_49 & 1) == 0) {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&current_major,"CMAKE_MINIMUM_REQUIRED_VERSION",
                     (allocator *)((long)&current_minor + 3));
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(pcVar1,(string *)&current_major,pcVar7);
          std::__cxx11::string::~string((string *)&current_major);
          std::allocator<char>::~allocator((allocator<char> *)((long)&current_minor + 3));
          current_patch = cmVersion::GetMajorVersion();
          current_tweak = cmVersion::GetMinorVersion();
          required_major = cmVersion::GetPatchVersion();
          required_minor = cmVersion::GetTweakVersion();
          required_patch = 0;
          required_tweak = 0;
          local_f0 = 0;
          local_f4 = 0;
          uVar8 = std::__cxx11::string::c_str();
          iVar3 = __isoc99_sscanf(uVar8,"%u.%u.%u.%u",&required_patch,&required_tweak,&local_f0,
                                  &local_f4);
          if (iVar3 < 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
            poVar9 = std::operator<<((ostream *)local_270,"could not parse VERSION \"");
            poVar9 = std::operator<<(poVar9,(string *)&i);
            std::operator<<(poVar9,"\".");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_290);
            std::__cxx11::string::~string((string *)&local_290);
            this_local._7_1_ = false;
            local_88 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
          }
          else if ((((current_patch < required_patch) ||
                    ((current_patch == required_patch && (current_tweak < required_tweak)))) ||
                   ((current_patch == required_patch &&
                    ((current_tweak == required_tweak && (required_major < local_f0)))))) ||
                  ((current_patch == required_patch &&
                   (((current_tweak == required_tweak && (required_major == local_f0)) &&
                    (required_minor < local_f4)))))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
            poVar9 = std::operator<<((ostream *)local_408,"CMake ");
            poVar9 = std::operator<<(poVar9,(string *)&i);
            poVar9 = std::operator<<(poVar9," or higher is required.  You are running version ");
            pcVar7 = cmVersion::GetCMakeVersion();
            std::operator<<(poVar9,pcVar7);
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_428);
            std::__cxx11::string::~string((string *)&local_428);
            cmSystemTools::SetFatalErrorOccured();
            this_local._7_1_ = true;
            local_88 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
          }
          else {
            bVar2 = EnforceUnknownArguments(this);
            if (bVar2) {
              if ((required_patch < 2) || ((required_patch == 2 && (required_tweak < 4)))) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_448,
                           "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.",
                           &local_449);
                cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_448);
                std::__cxx11::string::~string((string *)&local_448);
                std::allocator<char>::~allocator((allocator<char> *)&local_449);
                cmMakefile::SetPolicyVersion((this->super_cmCommand).Makefile,"2.4");
              }
              else {
                pcVar1 = (this->super_cmCommand).Makefile;
                pcVar7 = (char *)std::__cxx11::string::c_str();
                cmMakefile::SetPolicyVersion(pcVar1,pcVar7);
              }
              this_local._7_1_ = true;
              local_88 = 1;
            }
            else {
              this_local._7_1_ = false;
              local_88 = 1;
            }
          }
        }
        else {
          this_local._7_1_ = EnforceUnknownArguments(this);
          local_88 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a8,"called with no value for VERSION.",&local_a9);
        cmCommand::SetError(&this->super_cmCommand,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        this_local._7_1_ = false;
        local_88 = 1;
      }
LAB_005aa5f0:
      std::__cxx11::string::~string((string *)&i);
      return this_local._7_1_;
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_50);
    bVar2 = std::operator==(pvVar5,"VERSION");
    if (bVar2) {
      local_49 = 1;
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_50);
      bVar2 = std::operator==(pvVar5,"FATAL_ERROR");
      if (bVar2) {
        if ((local_49 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_80,"called with no value for VERSION.",&local_81);
          cmCommand::SetError(&this->super_cmCommand,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator((allocator<char> *)&local_81);
          this_local._7_1_ = false;
          local_88 = 1;
          goto LAB_005aa5f0;
        }
        local_49 = 0;
      }
      else if ((local_49 & 1) == 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->UnknownArguments,pvVar5);
      }
      else {
        local_49 = 0;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_50);
        std::__cxx11::string::operator=((string *)&i,(string *)pvVar5);
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool cmCMakeMinimumRequired
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  // Process arguments.
  std::string version_string;
  bool doing_version = false;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    if(args[i] == "VERSION")
      {
      doing_version = true;
      }
    else if(args[i] == "FATAL_ERROR")
      {
      if(doing_version)
        {
        this->SetError("called with no value for VERSION.");
        return false;
        }
      doing_version = false;
      }
    else if(doing_version)
      {
      doing_version = false;
      version_string = args[i];
      }
    else
      {
      this->UnknownArguments.push_back(args[i]);
      }
    }
  if(doing_version)
    {
    this->SetError("called with no value for VERSION.");
    return false;
    }

  // Make sure there was a version to check.
  if(version_string.empty())
    {
    return this->EnforceUnknownArguments();
    }

  // Save the required version string.
  this->Makefile->AddDefinition("CMAKE_MINIMUM_REQUIRED_VERSION",
                                version_string.c_str());


  // Get the current version number.
  unsigned int current_major = cmVersion::GetMajorVersion();
  unsigned int current_minor = cmVersion::GetMinorVersion();
  unsigned int current_patch = cmVersion::GetPatchVersion();
  unsigned int current_tweak = cmVersion::GetTweakVersion();

  // Parse at least two components of the version number.
  // Use zero for those not specified.
  unsigned int required_major = 0;
  unsigned int required_minor = 0;
  unsigned int required_patch = 0;
  unsigned int required_tweak = 0;
  if(sscanf(version_string.c_str(), "%u.%u.%u.%u",
            &required_major, &required_minor,
            &required_patch, &required_tweak) < 2)
    {
    std::ostringstream e;
    e << "could not parse VERSION \"" << version_string << "\".";
    this->SetError(e.str());
    return false;
    }

  // Compare the version numbers.
  if((current_major < required_major) ||
     (current_major == required_major &&
      current_minor < required_minor) ||
     (current_major == required_major &&
      current_minor == required_minor &&
      current_patch < required_patch) ||
     (current_major == required_major &&
      current_minor == required_minor &&
      current_patch == required_patch &&
      current_tweak < required_tweak))
    {
    // The current version is too low.
    std::ostringstream e;
    e << "CMake " << version_string
      << " or higher is required.  You are running version "
      << cmVersion::GetCMakeVersion();
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return true;
    }

  // The version is not from the future, so enforce unknown arguments.
  if(!this->EnforceUnknownArguments())
    {
    return false;
    }

  if (required_major < 2 || (required_major == 2 && required_minor < 4))
  {
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.");
    this->Makefile->SetPolicyVersion("2.4");
  }
  else
  {
    this->Makefile->SetPolicyVersion(version_string.c_str());
  }

  return true;
}